

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# external_signer.cpp
# Opt level: O0

RPCHelpMan * enumeratesigners(void)

{
  initializer_list<RPCResult> __l;
  initializer_list<RPCResult> __l_00;
  initializer_list<RPCResult> __l_01;
  RPCHelpMan *in_RDI;
  long in_FS_OFFSET;
  allocator<RPCResult> *in_stack_fffffffffffff7b8;
  uint uVar1;
  allocator<RPCResult> *this;
  RPCResult *this_00;
  anon_class_1_0_00000001 *in_stack_fffffffffffff7c0;
  function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *in_stack_fffffffffffff7c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff7e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff7f0;
  allocator<char> *in_stack_fffffffffffff7f8;
  char *in_stack_fffffffffffff800;
  undefined7 in_stack_fffffffffffff808;
  undefined1 in_stack_fffffffffffff80f;
  vector<RPCResult,_std::allocator<RPCResult>_> *in_stack_fffffffffffff810;
  undefined7 in_stack_fffffffffffff818;
  undefined1 in_stack_fffffffffffff81f;
  undefined7 in_stack_fffffffffffff820;
  undefined1 in_stack_fffffffffffff827;
  string *in_stack_fffffffffffff828;
  undefined4 in_stack_fffffffffffff830;
  Type in_stack_fffffffffffff834;
  undefined4 in_stack_fffffffffffff838;
  Type in_stack_fffffffffffff83c;
  RPCResult *in_stack_fffffffffffff840;
  undefined1 *local_7b0;
  undefined1 *local_798;
  undefined1 *local_780;
  RPCExamples *examples;
  RPCResults *results;
  vector<RPCArg,_std::allocator<RPCArg>_> *args;
  string *description;
  string *name;
  RPCHelpMan *this_01;
  allocator<char> local_61f;
  allocator<char> local_61e;
  allocator<char> local_61d;
  allocator<char> local_61c [4];
  pointer local_618;
  pointer pRStack_610;
  pointer local_608;
  allocator<char> local_5fa;
  allocator<char> local_5f9;
  _Alloc_hider local_5f8;
  size_type sStack_5f0;
  undefined8 local_5e8;
  undefined8 in_stack_fffffffffffffa20;
  allocator<char> local_5d2;
  allocator<char> local_5d1 [31];
  undefined1 local_5b2;
  RPCResults local_5b1;
  undefined1 local_592;
  undefined1 local_591 [31];
  undefined1 local_572;
  undefined1 local_571 [64];
  allocator<char> local_531 [385];
  undefined1 local_3b0 [272];
  undefined1 local_2a0 [64];
  undefined1 local_260 [136];
  undefined1 local_1d8 [64];
  undefined1 local_198 [136];
  undefined1 local_110 [264];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff80f,in_stack_fffffffffffff808),in_stack_fffffffffffff800
             ,in_stack_fffffffffffff7f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff80f,in_stack_fffffffffffff808),in_stack_fffffffffffff800
             ,in_stack_fffffffffffff7f8);
  local_571._25_8_ = 0;
  local_571._33_8_ = 0;
  local_571._41_8_ = 0;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff7b8);
  this_01 = (RPCHelpMan *)local_571;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff80f,in_stack_fffffffffffff808),in_stack_fffffffffffff800
             ,in_stack_fffffffffffff7f8);
  name = (string *)&local_572;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff80f,in_stack_fffffffffffff808),in_stack_fffffffffffff800
             ,in_stack_fffffffffffff7f8);
  description = (string *)local_591;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff80f,in_stack_fffffffffffff808),in_stack_fffffffffffff800
             ,in_stack_fffffffffffff7f8);
  args = (vector<RPCArg,_std::allocator<RPCArg>_> *)&local_592;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff80f,in_stack_fffffffffffff808),in_stack_fffffffffffff800
             ,in_stack_fffffffffffff7f8);
  results = &local_5b1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff80f,in_stack_fffffffffffff808),in_stack_fffffffffffff800
             ,in_stack_fffffffffffff7f8);
  examples = (RPCExamples *)&local_5b2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff80f,in_stack_fffffffffffff808),in_stack_fffffffffffff800
             ,in_stack_fffffffffffff7f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff80f,in_stack_fffffffffffff808),in_stack_fffffffffffff800
             ,in_stack_fffffffffffff7f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff80f,in_stack_fffffffffffff808),in_stack_fffffffffffff800
             ,in_stack_fffffffffffff7f8);
  local_5f8._M_p = (pointer)0x0;
  sStack_5f0 = 0;
  local_5e8 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff7b8);
  RPCResult::RPCResult
            (in_stack_fffffffffffff840,in_stack_fffffffffffff83c,
             (string *)CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830),
             in_stack_fffffffffffff828,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT17(in_stack_fffffffffffff827,in_stack_fffffffffffff820),
             (bool)in_stack_fffffffffffff81f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff80f,in_stack_fffffffffffff808),in_stack_fffffffffffff800
             ,in_stack_fffffffffffff7f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff80f,in_stack_fffffffffffff808),in_stack_fffffffffffff800
             ,in_stack_fffffffffffff7f8);
  local_618 = (pointer)0x0;
  pRStack_610 = (pointer)0x0;
  local_608 = (pointer)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff7b8);
  RPCResult::RPCResult
            (in_stack_fffffffffffff840,in_stack_fffffffffffff83c,
             (string *)CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830),
             in_stack_fffffffffffff828,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT17(in_stack_fffffffffffff827,in_stack_fffffffffffff820),
             (bool)in_stack_fffffffffffff81f);
  std::allocator<RPCResult>::allocator(in_stack_fffffffffffff7b8);
  __l._M_len._0_7_ = in_stack_fffffffffffff808;
  __l._M_array = (iterator)in_stack_fffffffffffff800;
  __l._M_len._7_1_ = in_stack_fffffffffffff80f;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff7f8,__l,
             (allocator_type *)in_stack_fffffffffffff7f0);
  RPCResult::RPCResult
            (in_stack_fffffffffffff840,in_stack_fffffffffffff83c,
             (string *)CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830),
             in_stack_fffffffffffff828,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT17(in_stack_fffffffffffff827,in_stack_fffffffffffff820),
             (bool)in_stack_fffffffffffff81f);
  std::allocator<RPCResult>::allocator(in_stack_fffffffffffff7b8);
  uVar1 = (uint)((ulong)in_stack_fffffffffffff7b8 >> 0x20);
  __l_00._M_len._0_7_ = in_stack_fffffffffffff808;
  __l_00._M_array = (iterator)in_stack_fffffffffffff800;
  __l_00._M_len._7_1_ = in_stack_fffffffffffff80f;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff7f8,__l_00,
             (allocator_type *)in_stack_fffffffffffff7f0);
  this = (allocator<RPCResult> *)((ulong)uVar1 << 0x20);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_fffffffffffff83c,in_stack_fffffffffffff838),
             in_stack_fffffffffffff834,in_stack_fffffffffffff828,(bool)in_stack_fffffffffffff827,
             (string *)CONCAT17(in_stack_fffffffffffff81f,in_stack_fffffffffffff818),
             in_stack_fffffffffffff810,(bool)in_stack_fffffffffffff80f);
  std::allocator<RPCResult>::allocator(this);
  __l_01._M_len._0_7_ = in_stack_fffffffffffff808;
  __l_01._M_array = (iterator)in_stack_fffffffffffff800;
  __l_01._M_len._7_1_ = in_stack_fffffffffffff80f;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff7f8,__l_01,
             (allocator_type *)in_stack_fffffffffffff7f0);
  RPCResult::RPCResult
            (in_stack_fffffffffffff840,in_stack_fffffffffffff83c,
             (string *)CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830),
             in_stack_fffffffffffff828,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT17(in_stack_fffffffffffff827,in_stack_fffffffffffff820),
             (bool)in_stack_fffffffffffff81f);
  RPCResults::RPCResults
            ((RPCResults *)CONCAT44(in_stack_fffffffffffff83c,in_stack_fffffffffffff838),
             (RPCResult *)CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff80f,in_stack_fffffffffffff808),in_stack_fffffffffffff800
             ,in_stack_fffffffffffff7f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff80f,in_stack_fffffffffffff808),in_stack_fffffffffffff800
             ,in_stack_fffffffffffff7f8);
  HelpExampleCli(in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff80f,in_stack_fffffffffffff808),in_stack_fffffffffffff800
             ,in_stack_fffffffffffff7f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff80f,in_stack_fffffffffffff808),in_stack_fffffffffffff800
             ,in_stack_fffffffffffff7f8);
  HelpExampleRpc(in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8);
  std::operator+(in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8);
  RPCExamples::RPCExamples((RPCExamples *)this,(string *)0xe3ba6b);
  this_00 = (RPCResult *)&stack0xfffffffffffff9c0;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::
  function<enumeratesigners()::__0,void>(in_stack_fffffffffffff7c8,in_stack_fffffffffffff7c0);
  RPCHelpMan::RPCHelpMan
            (this_01,name,description,args,results,examples,
             (RPCMethodImpl *)in_stack_fffffffffffffa20);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this_00);
  RPCExamples::~RPCExamples((RPCExamples *)this_00);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator(&local_61f);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator(&local_61e);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator(&local_61d);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator(local_61c);
  RPCResults::~RPCResults((RPCResults *)this_00);
  RPCResult::~RPCResult(this_00);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff7c8);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this_00);
  local_780 = local_110;
  do {
    local_780 = local_780 + -0x88;
    RPCResult::~RPCResult(this_00);
  } while (local_780 != local_198);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff7c8);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this_00);
  local_798 = local_1d8;
  do {
    local_798 = local_798 + -0x88;
    RPCResult::~RPCResult(this_00);
  } while (local_798 != local_260);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff7c8);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this_00);
  local_7b0 = local_2a0;
  do {
    local_7b0 = local_7b0 + -0x88;
    RPCResult::~RPCResult(this_00);
  } while (local_7b0 != local_3b0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff7c8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator(&local_5fa);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator(&local_5f9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff7c8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator(&local_5d2);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator(local_5d1);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator((allocator<char> *)&local_5b2);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator((allocator<char> *)&local_5b1);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator((allocator<char> *)&local_592);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator((allocator<char> *)local_591);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator((allocator<char> *)&local_572);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator((allocator<char> *)local_571);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff7c8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator((allocator<char> *)(local_571 + 0x3f));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator(local_531);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan enumeratesigners()
{
    return RPCHelpMan{"enumeratesigners",
        "Returns a list of external signers from -signer.",
        {},
        RPCResult{
            RPCResult::Type::OBJ, "", "",
            {
                {RPCResult::Type::ARR, "signers", /*optional=*/false, "",
                {
                    {RPCResult::Type::OBJ, "", "",
                    {
                        {RPCResult::Type::STR_HEX, "fingerprint", "Master key fingerprint"},
                        {RPCResult::Type::STR, "name", "Device name"},
                    }},
                },
                }
            }
        },
        RPCExamples{
            HelpExampleCli("enumeratesigners", "")
            + HelpExampleRpc("enumeratesigners", "")
        },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
        {
            const std::string command = gArgs.GetArg("-signer", "");
            if (command == "") throw JSONRPCError(RPC_MISC_ERROR, "Error: restart bitcoind with -signer=<cmd>");
            const std::string chain = gArgs.GetChainTypeString();
            UniValue signers_res = UniValue::VARR;
            try {
                std::vector<ExternalSigner> signers;
                ExternalSigner::Enumerate(command, signers, chain);
                for (const ExternalSigner& signer : signers) {
                    UniValue signer_res = UniValue::VOBJ;
                    signer_res.pushKV("fingerprint", signer.m_fingerprint);
                    signer_res.pushKV("name", signer.m_name);
                    signers_res.push_back(std::move(signer_res));
                }
            } catch (const std::exception& e) {
                throw JSONRPCError(RPC_MISC_ERROR, e.what());
            }
            UniValue result(UniValue::VOBJ);
            result.pushKV("signers", std::move(signers_res));
            return result;
        }
    };
}